

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void __thiscall kratos::StmtFileNameVisitor::visit(StmtFileNameVisitor *this,AssignStmt *stmt)

{
  const_iterator cVar1;
  mapped_type *__in;
  AssignStmt *local_30;
  AssignStmt *local_28;
  string *local_20;
  
  local_28 = stmt;
  cVar1 = std::
          _Rb_tree<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
          ::find((_Rb_tree<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                  *)this->stmt_fn_ln_,(key_type *)&local_28);
  if (cVar1._M_node != (_Base_ptr)(this->stmt_fn_ln_ + 8)) {
    local_30 = stmt;
    __in = std::
           map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
           ::at(this->stmt_fn_ln_,(key_type *)&local_30);
    local_20 = &this->filename;
    local_28 = (AssignStmt *)&this->ln;
    std::tuple<std::__cxx11::string&,unsigned_int&>::operator=
              ((tuple<std::__cxx11::string&,unsigned_int&> *)&local_28,__in);
  }
  return;
}

Assistant:

void visit(AssignStmt *stmt) override {
        if (stmt_fn_ln_.find(stmt) != stmt_fn_ln_.end()) {
            std::tie(filename, ln) = stmt_fn_ln_.at(stmt);
        }
    }